

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O3

int bhitm(monst *mtmp,obj *otmp)

{
  char oclass;
  ushort otyp;
  permonst *ptr;
  boolean bVar1;
  int iVar2;
  uint uVar3;
  obj *poVar4;
  char *pcVar5;
  char *force;
  char *pcVar6;
  int tmp;
  int iVar7;
  int tmp_2;
  int iVar8;
  byte bVar9;
  bool bVar10;
  char nambuf [256];
  char local_138 [264];
  
  otyp = otmp->otyp;
  iVar7 = (int)(short)otyp;
  ptr = mtmp->data;
  bVar10 = true;
  if (ptr->mlet == '\r') {
    bVar10 = mtmp->m_ap_type == '\0';
  }
  bVar9 = urole.malenum == 0x15f & (u.uhave._0_1_ & 0x10) >> 4;
  if (otyp < 0x1be) {
    switch(otyp) {
    case 0x185:
switchD_0028eae4_caseD_196:
      if (ptr == mons + 0x145) {
        oclass = otmp->oclass;
        iVar2 = 3;
        iVar8 = -3;
        do {
          uVar3 = mt_random();
          iVar2 = iVar2 + (uVar3 & (uint)(iVar7 == 0x196) * 4 + 3);
          iVar8 = iVar8 + 1;
        } while (iVar8 != 0);
        resist(mtmp,oclass,iVar2,1);
        bVar10 = false;
        goto LAB_0028f64f;
      }
      iVar2 = 6;
      iVar8 = -6;
      do {
        uVar3 = mt_random();
        iVar2 = iVar2 + (uVar3 & (uint)(iVar7 == 0x196) * 4 + 3);
        iVar8 = iVar8 + 1;
      } while (iVar8 != 0);
      iVar2 = iVar2 + mtmp->mhp;
      if (mtmp->mhpmax <= iVar2) {
        iVar2 = mtmp->mhpmax;
      }
      mtmp->mhp = iVar2;
      if (mtmp->mblinded != '\0') {
        mtmp->mblinded = '\0';
        mtmp->field_0x62 = mtmp->field_0x62 | 2;
      }
      if (mtmp->wormno == '\0') {
        if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_0028f517;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0028f2be;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0028f2b5;
        }
        else {
LAB_0028f2b5:
          if (ublindf == (obj *)0x0) goto LAB_0028f5b4;
LAB_0028f2be:
          if (ublindf->oartifact != '\x1d') goto LAB_0028f5b4;
        }
        if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
             (((youmonst.data)->mflags3 & 0x100) != 0)) &&
            ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) && ((mtmp->data->mflags3 & 0x200) != 0))
        goto LAB_0028f517;
      }
      else {
        bVar1 = worm_known(level,mtmp);
        if (bVar1 != '\0') {
LAB_0028f517:
          uVar3 = *(uint *)&mtmp->field_0x60;
          if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar3 & 0x280) == 0) goto LAB_0028f555;
          }
          else if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0028f555:
            if ((u._1052_1_ & 0x20) == 0) {
              if (bVar10) {
                pcVar5 = Monnam(mtmp);
                pcVar6 = "";
                if (iVar7 == 0x196) {
                  pcVar6 = " much";
                }
                pline("%s looks%s better.",pcVar5,pcVar6);
              }
              else if ((mtmp->m_ap_type == '\x02') && (mtmp->mappearance == 0)) {
                set_mimic_sym(mtmp,level);
                newsym((int)mtmp->mx,(int)mtmp->my);
              }
              else {
                mimic_hit_msg(mtmp,otyp);
              }
            }
          }
        }
      }
LAB_0028f5b4:
      if ((mtmp->mtame != '\0') || ((mtmp->field_0x62 & 0x40) != 0)) {
        iVar7 = 1;
        if (urole.malenum != 0x15e) {
          iVar7 = sgn((int)u.ualign.type);
        }
        adjalign(iVar7);
      }
      goto LAB_0028f692;
    case 0x186:
      goto switchD_0028ea9d_caseD_1cc;
    case 0x187:
      pcVar5 = "spell";
      goto LAB_0028efd5;
    case 0x18a:
      uVar3 = mt_random();
      iVar7 = spell_damage_bonus();
      bVar1 = resists_drli(mtmp);
      if (bVar1 == '\0') {
        iVar7 = ((uVar3 & 7) + 1 << bVar9) + iVar7;
        iVar2 = resist(mtmp,otmp->oclass,iVar7,0);
        bVar10 = true;
        if ((iVar2 == 0) && (iVar2 = mtmp->mhp, 0 < iVar2)) {
          iVar8 = mtmp->mhpmax - iVar7;
          mtmp->mhp = iVar2 - iVar7;
          mtmp->mhpmax = iVar8;
          if ((0 < iVar8 && (iVar2 - iVar7 != 0 && iVar7 <= iVar2)) && (mtmp->m_lev != '\0')) {
            mtmp->m_lev = mtmp->m_lev + 0xff;
            if (mtmp->wormno == '\0') {
              if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0028fc6b;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0028fc62;
                }
                else {
LAB_0028fc62:
                  if (ublindf == (obj *)0x0) goto LAB_0028f64f;
LAB_0028fc6b:
                  if (ublindf->oartifact != '\x1d') goto LAB_0028f64f;
                }
                if (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                    (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                   ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0)) goto LAB_0028f64c;
                if ((mtmp->data->mflags3 & 0x200) == 0) goto LAB_0028f64f;
              }
            }
            else {
              bVar1 = worm_known(level,mtmp);
              if (bVar1 == '\0') goto LAB_0028f64f;
            }
            uVar3 = *(uint *)&mtmp->field_0x60;
            if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar3 & 0x280) == 0) goto LAB_00290011;
            }
            else if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00290011:
              if ((u._1052_1_ & 0x20) == 0) {
                pcVar5 = Monnam(mtmp);
                pcVar6 = "%s suddenly seems weaker!";
                goto LAB_0028fc1c;
              }
            }
            goto LAB_0028f64f;
          }
          xkilled(mtmp,1);
        }
      }
      else {
        shieldeff(mtmp->mx,mtmp->my);
      }
LAB_0028f64c:
      bVar10 = true;
      goto LAB_0028f64f;
    case 0x18b:
      goto switchD_0028ea9d_caseD_1c6;
    case 0x18c:
      return 0;
    default:
      switch(otyp) {
      case 0x196:
        goto switchD_0028eae4_caseD_196;
      case 0x197:
      case 0x198:
      case 0x199:
      case 0x19a:
      case 0x19b:
      case 0x19c:
      case 0x1a0:
      case 0x1a2:
      case 0x1a3:
        break;
      case 0x19d:
        goto switchD_0028ea9d_caseD_1c8;
      case 0x19e:
switchD_0028ea9d_caseD_1c9:
        bVar1 = resists_magm(mtmp);
        if (bVar1 != '\0') {
          shieldeff(mtmp->mx,mtmp->my);
          goto LAB_0028f142;
        }
        iVar2 = resist(mtmp,otmp->oclass,0,0);
        bVar10 = true;
        if (iVar2 != 0) goto LAB_0028f64f;
        if (((mtmp->field_0x60 & 0x70) == 0) &&
           (uVar3 = mt_random(), uVar3 * -0x3d70a3d7 < 0xa3d70a4)) {
          if (mtmp->wormno == '\0') {
            if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_0028fec7;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0028fb16;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0028fb0d;
            }
            else {
LAB_0028fb0d:
              if (ublindf == (obj *)0x0) goto LAB_0028ff39;
LAB_0028fb16:
              if (ublindf->oartifact != '\x1d') goto LAB_0028ff39;
            }
            if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                 (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) && ((mtmp->data->mflags3 & 0x200) != 0)
               ) goto LAB_0028fec7;
          }
          else {
            bVar1 = worm_known(level,mtmp);
            if (bVar1 != '\0') {
LAB_0028fec7:
              uVar3 = *(uint *)&mtmp->field_0x60;
              if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((uVar3 & 0x280) == 0) goto LAB_0028ff05;
              }
              else if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0028ff05:
                if ((u._1052_1_ & 0x20) == 0) {
                  pcVar5 = Monnam(mtmp);
                  pline("%s shudders!",pcVar5);
                  discover_object(iVar7,'\x01','\x01');
                }
              }
            }
          }
LAB_0028ff39:
          for (poVar4 = mtmp->minvent; poVar4 != (obj *)0x0; poVar4 = poVar4->nobj) {
            bypass_obj(poVar4);
          }
          xkilled(mtmp,3);
          goto LAB_0028f64f;
        }
        iVar2 = newcham(level,mtmp,(permonst *)0x0,iVar7 != 0x13a,'\0');
        if ((iVar2 == 0) ||
           (((u.uprops[0x23].intrinsic != 0 && (u.uprops[0x24].extrinsic == 0)) &&
            ((u.umonnum == u.umonster || (bVar1 = dmgtype(youmonst.data,0x24), bVar1 == '\0'))))))
        goto LAB_0028f64f;
        if (mtmp->wormno == '\0') {
          if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_0028fcd2;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0028f9ef;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0028f9e6;
          }
          else {
LAB_0028f9e6:
            if (ublindf == (obj *)0x0) goto LAB_0028fd1d;
LAB_0028f9ef:
            if (ublindf->oartifact != '\x1d') goto LAB_0028fd1d;
          }
          if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
               (((youmonst.data)->mflags3 & 0x100) != 0)) &&
              ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) && ((mtmp->data->mflags3 & 0x200) != 0))
          goto LAB_0028fcd2;
LAB_0028fd1d:
          if (((mtmp->data->mflags1 & 0x10000) == 0) &&
             ((poVar4 = which_armor(mtmp,4), poVar4 == (obj *)0x0 ||
              (poVar4 = which_armor(mtmp,4), poVar4->otyp != 0x4f)))) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0028fd73;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0028fd6e;
            }
            else {
LAB_0028fd6e:
              if (ublindf != (obj *)0x0) {
LAB_0028fd73:
                if (ublindf->oartifact == '\x1d') goto LAB_0028fdff;
              }
              if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                   (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                   youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
              goto LAB_0028fe53;
            }
LAB_0028fdff:
            if ((u.uprops[0x19].extrinsic != 0) &&
               ((u.uprops[0x19].blocked == 0 &&
                (iVar2 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar2 < 0x41))))
            goto LAB_0028fe53;
          }
          if ((u.uprops[0x42].intrinsic == 0) &&
             ((u.uprops[0x42].extrinsic == 0 && (bVar1 = match_warn_of_mon(mtmp), bVar1 == '\0'))))
          goto LAB_0028f64f;
        }
        else {
          bVar1 = worm_known(level,mtmp);
          if (bVar1 == '\0') goto LAB_0028fd1d;
LAB_0028fcd2:
          uVar3 = *(uint *)&mtmp->field_0x60;
          if ((((uVar3 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
             (u.uprops[0xc].extrinsic == 0)) {
            if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
            goto LAB_0028fd10;
            goto LAB_0028fd1d;
          }
          if ((uVar3 & 0x280) != 0) goto LAB_0028fd1d;
LAB_0028fd10:
          if ((u._1052_1_ & 0x20) != 0) goto LAB_0028fd1d;
        }
LAB_0028fe53:
        discover_object(iVar7,'\x01','\x01');
        goto LAB_0028f64f;
      case 0x19f:
        goto switchD_0028ea9d_caseD_1cb;
      case 0x1a1:
        goto switchD_0028ea9d_caseD_1ca;
      case 0x1a4:
        iVar7 = monsndx(ptr);
        if (iVar7 != 0x108) {
          return 0;
        }
        pcVar5 = Monnam(mtmp);
        iVar7 = newcham(level,mtmp,mons + 0x106,'\0','\0');
        if (iVar7 == 0) {
          if (mtmp->wormno == '\0') {
            if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0028f631;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0028f628;
              }
              else {
LAB_0028f628:
                if (ublindf == (obj *)0x0) goto LAB_0028f142;
LAB_0028f631:
                bVar10 = true;
                if (ublindf->oartifact != '\x1d') goto LAB_0028f64f;
              }
              if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                   (bVar10 = true, ((youmonst.data)->mflags3 & 0x100) == 0)) ||
                  (bVar10 = true, (viz_array[mtmp->my][mtmp->mx] & 1U) == 0)) ||
                 ((mtmp->data->mflags3 & 0x200) == 0)) goto LAB_0028f64f;
            }
          }
          else {
            bVar1 = worm_known(level,mtmp);
            if (bVar1 == '\0') goto LAB_0028f142;
          }
          uVar3 = *(uint *)&mtmp->field_0x60;
          if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            bVar10 = true;
            if ((uVar3 & 0x280) == 0) goto LAB_0028fc02;
          }
          else {
            bVar10 = true;
            if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0028fc02:
              bVar10 = true;
              if ((u._1052_1_ & 0x20) == 0) {
                pcVar6 = "%s looks rather fleshy for a moment.";
                goto LAB_0028fc1c;
              }
            }
          }
        }
        else {
          if (mtmp->wormno == '\0') {
            if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0028f4a1;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0028f498;
              }
              else {
LAB_0028f498:
                if (ublindf == (obj *)0x0) goto LAB_0028f142;
LAB_0028f4a1:
                bVar10 = true;
                if (ublindf->oartifact != '\x1d') goto LAB_0028f64f;
              }
              if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                   (bVar10 = true, ((youmonst.data)->mflags3 & 0x100) == 0)) ||
                  (bVar10 = true, (viz_array[mtmp->my][mtmp->mx] & 1U) == 0)) ||
                 ((mtmp->data->mflags3 & 0x200) == 0)) goto LAB_0028f64f;
            }
          }
          else {
            bVar1 = worm_known(level,mtmp);
            if (bVar1 == '\0') goto LAB_0028f142;
          }
          uVar3 = *(uint *)&mtmp->field_0x60;
          if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            bVar10 = true;
            if ((uVar3 & 0x280) == 0) goto LAB_0028fab7;
          }
          else {
            bVar10 = true;
            if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0028fab7:
              bVar10 = true;
              if ((u._1052_1_ & 0x20) == 0) {
                pcVar6 = "%s turns to flesh!";
LAB_0028fc1c:
                bVar10 = true;
                pline(pcVar6,pcVar5);
              }
            }
          }
        }
        goto LAB_0028f64f;
      default:
        if (otyp == 0x13a) goto switchD_0028ea9d_caseD_1c9;
      }
    case 0x188:
    case 0x189:
switchD_0028ea9d_caseD_1bf:
      warning("What an interesting effect (%d)");
    }
    goto LAB_0028f142;
  }
  switch(otyp) {
  case 0x1be:
    iVar7 = flash_hits_mon(mtmp,otmp);
    if (iVar7 != 0) {
      iVar7 = 0x1be;
LAB_0028f38c:
      discover_object(iVar7,'\x01','\x01');
      goto LAB_0028f39b;
    }
    goto LAB_0028f142;
  default:
    goto switchD_0028ea9d_caseD_1bf;
  case 0x1c3:
  case 0x1cd:
    return 0;
  case 0x1c4:
    pcVar5 = "wand";
LAB_0028efd5:
    bVar1 = resists_magm(mtmp);
    if (bVar1 == '\0') {
      if ((u._1052_1_ & 1) == 0) {
        uVar3 = mt_random();
        iVar2 = find_mac(mtmp);
        if (iVar2 + 9 <= (int)(uVar3 % 0x14)) {
          miss(pcVar5,mtmp);
          goto LAB_0028f38c;
        }
      }
      iVar8 = 2;
      iVar2 = -2;
      do {
        uVar3 = mt_random();
        iVar8 = iVar8 + uVar3 % 0xc;
        iVar2 = iVar2 + 1;
      } while (iVar2 != 0);
      uVar3 = iVar8 << bVar9;
      if (iVar7 == 0x187) {
        iVar2 = spell_damage_bonus();
        uVar3 = uVar3 + iVar2;
      }
      pcVar6 = "!";
      if (uVar3 < 5) {
        pcVar6 = ".";
      }
      force = "?";
      if (-1 < (int)uVar3) {
        force = pcVar6;
      }
      hit(pcVar5,'\0',mtmp,force);
      resist(mtmp,otmp->oclass,uVar3,1);
      goto LAB_0028f38c;
    }
    shieldeff(mtmp->mx,mtmp->my);
    goto LAB_0028f39b;
  case 0x1c5:
    bVar9 = mtmp->field_0x60;
    pcVar5 = Monnam(mtmp);
    strcpy(local_138,pcVar5);
    mon_set_minvis(mtmp);
    if (((bVar9 & 2) == 0) && ((mtmp->field_0x60 & 2) != 0)) {
      if (((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) ||
         (((u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0 &&
           (((youmonst.data)->mflags1 & 0x1000000) == 0)) &&
          ((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)))))) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0028efbb;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0028efb2;
        }
        else {
LAB_0028efb2:
          if (ublindf == (obj *)0x0) goto LAB_0028f142;
LAB_0028efbb:
          if (ublindf->oartifact != '\x1d') goto LAB_0028f142;
        }
        if (((u.uprops[0x19].intrinsic & 0xf8ffffff) == 0) ||
           (iVar7 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar7))
        goto LAB_0028f142;
      }
      pline("%s turns transparent!",local_138);
      discover_object(0x1c5,'\x01','\x01');
    }
    goto LAB_0028f142;
  case 0x1c6:
switchD_0028ea9d_caseD_1c6:
    iVar7 = resist(mtmp,otmp->oclass,0,0);
    bVar10 = true;
    if (iVar7 == 0) {
      mon_adjust_speed(mtmp,-1,otmp);
      m_dowear(level,mtmp,'\0');
      if ((((u._1052_1_ & 1) != 0) && (u.ustuck == mtmp)) &&
         (mtmp->data == mons + 0x9f || mtmp->data->mlet == '\x16')) {
        pcVar5 = mon_nam(mtmp);
        pline("You disrupt %s!",pcVar5);
        pline("A huge hole opens up...");
        expels(mtmp,mtmp->data,'\x01');
      }
    }
    break;
  case 0x1c7:
    iVar7 = resist(mtmp,otmp->oclass,0,0);
    bVar10 = true;
    if (iVar7 == 0) {
      mon_adjust_speed(mtmp,1,otmp);
      m_dowear(level,mtmp,'\0');
    }
    break;
  case 0x1c8:
switchD_0028ea9d_caseD_1c8:
    iVar2 = unturn_dead(mtmp);
    if ((mtmp->data->mflags2 & 2) == 0) {
      bVar10 = true;
      if (iVar2 == 0) {
        return 0;
      }
    }
    else {
      uVar3 = mt_random();
      iVar2 = (uVar3 & 7) + 1 << bVar9;
      if (iVar7 == 0x19d) {
        iVar7 = spell_damage_bonus();
        iVar2 = iVar2 + iVar7;
      }
      flags.bypasses = '\x01';
      bVar10 = false;
      iVar7 = resist(mtmp,otmp->oclass,iVar2,0);
      if (iVar7 == 0) {
        if (mtmp->mhp < 1) goto LAB_0028f39b;
        bVar10 = false;
        monflee(mtmp,0,'\0','\x01');
      }
    }
    break;
  case 0x1c9:
    goto switchD_0028ea9d_caseD_1c9;
  case 0x1ca:
switchD_0028ea9d_caseD_1ca:
    cancel_monst(mtmp,otmp,'\x01','\x01','\0');
LAB_0028f142:
    bVar10 = true;
    break;
  case 0x1cb:
switchD_0028ea9d_caseD_1cb:
    bVar1 = u_teleport_mon(mtmp,'\x01');
    bVar10 = bVar1 != '\0';
    break;
  case 0x1cc:
switchD_0028ea9d_caseD_1cc:
    if (((u._1052_1_ & 1) == 0) || (u.ustuck != mtmp)) {
      poVar4 = which_armor(mtmp,0x100000);
      if (poVar4 == (obj *)0x0) {
        return 0;
      }
      mtmp->misc_worn_check = mtmp->misc_worn_check & ~poVar4->owornmask;
      update_mon_intrinsics(level,mtmp,poVar4,'\0','\0');
      poVar4->owornmask = 0;
      obj_extract_self(poVar4);
      place_object(poVar4,level,(int)mtmp->mx,(int)mtmp->my);
      newsym((int)mtmp->mx,(int)mtmp->my);
      return 0;
    }
    if ((ptr->mflags1 & 0x40000) == 0) goto LAB_0028f3e2;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0028ecb1;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0028ecac;
LAB_0028f3c9:
      pcVar5 = Monnam(mtmp);
      pline("%s opens its mouth!",pcVar5);
    }
    else {
LAB_0028ecac:
      if (ublindf != (obj *)0x0) {
LAB_0028ecb1:
        if (ublindf->oartifact == '\x1d') goto LAB_0028f3c9;
      }
      pline("You feel a sudden rush of air!");
    }
LAB_0028f3e2:
    expels(mtmp,mtmp->data,'\x01');
    return 0;
  case 0x1ce:
    probe_monster(mtmp);
    discover_object(0x1ce,'\x01','\x01');
    goto LAB_0028f692;
  case 0x1d3:
    iVar7 = otmp->spe + 1;
    iVar8 = 0;
    for (iVar2 = iVar7; iVar2 != 0; iVar2 = iVar2 + -1) {
      uVar3 = mt_random();
      iVar7 = iVar7 + uVar3 % 0xc;
      iVar8 = iVar7;
    }
    iVar7 = sleep_monst(mtmp,iVar8,0xb);
    if (iVar7 != 0) {
      slept_monst(mtmp);
    }
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0028ef2f;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0028ef26;
LAB_0028f376:
      iVar7 = 0x1d3;
      goto LAB_0028f38c;
    }
LAB_0028ef26:
    if (ublindf != (obj *)0x0) {
LAB_0028ef2f:
      if (ublindf->oartifact == '\x1d') goto LAB_0028f376;
    }
LAB_0028f39b:
    bVar10 = false;
  }
LAB_0028f64f:
  if (mtmp->mhp < 1) {
    if (mtmp->m_ap_type != '\0') {
      seemimic(mtmp);
    }
  }
  else {
    wakeup(mtmp);
    m_respond(mtmp);
    if (((mtmp->field_0x63 & 2) != 0) && (u.ushops[0] == '\0')) {
      hot_pursuit(mtmp);
    }
  }
  if (bVar10) {
    return 0;
  }
LAB_0028f692:
  if (mtmp->mhp < 1) {
    return 0;
  }
  if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
    return 0;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_0028f775;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0028f71a;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0028f711;
    }
    else {
LAB_0028f711:
      if (ublindf == (obj *)0x0) goto LAB_0028f7c0;
LAB_0028f71a:
      if (ublindf->oartifact != '\x1d') goto LAB_0028f7c0;
    }
    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
         (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))
       && ((mtmp->data->mflags3 & 0x200) != 0)) goto LAB_0028f775;
  }
  else {
    bVar1 = worm_known(level,mtmp);
    if (bVar1 != '\0') {
LAB_0028f775:
      uVar3 = *(uint *)&mtmp->field_0x60;
      if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar3 & 0x280) == 0) goto LAB_0028f7b3;
      }
      else if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0028f7b3:
        if ((u._1052_1_ & 0x20) == 0) {
          return 0;
        }
      }
    }
  }
LAB_0028f7c0:
  if (((mtmp->data->mflags1 & 0x10000) != 0) ||
     ((poVar4 = which_armor(mtmp,4), poVar4 != (obj *)0x0 &&
      (poVar4 = which_armor(mtmp,4), poVar4->otyp == 0x4f)))) goto LAB_0028f8c8;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0028f810;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0028f80b;
  }
  else {
LAB_0028f80b:
    if (ublindf != (obj *)0x0) {
LAB_0028f810:
      if (ublindf->oartifact == '\x1d') goto LAB_0028f89c;
    }
    if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
         (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
         youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) {
      return 0;
    }
  }
LAB_0028f89c:
  if (((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) &&
     (iVar7 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar7 < 0x41)) {
    return 0;
  }
LAB_0028f8c8:
  if (((u.uprops[0x42].intrinsic == 0) && (u.uprops[0x42].extrinsic == 0)) &&
     (bVar1 = match_warn_of_mon(mtmp), bVar1 == '\0')) {
    map_invisible(bhitpos.x,bhitpos.y);
  }
  return 0;
}

Assistant:

int bhitm(struct monst *mtmp, struct obj *otmp)
{
	boolean wake = TRUE;	/* Most 'zaps' should wake monster */
	boolean reveal_invis = FALSE;
	boolean dbldam = Role_if (PM_KNIGHT) && u.uhave.questart;
	int dmg, otyp = otmp->otyp;
	const char *zap_type_text = "spell";
	struct obj *obj;
	boolean disguised_mimic = (mtmp->data->mlet == S_MIMIC &&
				   mtmp->m_ap_type != M_AP_NOTHING);

	if (u.uswallow && mtmp == u.ustuck)
	    reveal_invis = FALSE;

	switch(otyp) {
	case WAN_STRIKING:
		zap_type_text = "wand";
		/* fall through */
	case SPE_FORCE_BOLT:
		reveal_invis = TRUE;
		if (resists_magm(mtmp)) {	/* match effect on player */
			shieldeff(mtmp->mx, mtmp->my);
			break;	/* skip makeknown */
		} else if (u.uswallow || rnd(20) < 10 + find_mac(mtmp)) {
			dmg = dice(2,12);
			if (dbldam) dmg *= 2;
			if (otyp == SPE_FORCE_BOLT)
			    dmg += spell_damage_bonus();
			hit(zap_type_text, FALSE, mtmp, exclam(dmg));
			resist(mtmp, otmp->oclass, dmg, TELL);
		} else miss(zap_type_text, mtmp);
		makeknown(otyp);
		break;
	case WAN_SLOW_MONSTER:
	case SPE_SLOW_MONSTER:
		if (!resist(mtmp, otmp->oclass, 0, NOTELL)) {
			mon_adjust_speed(mtmp, -1, otmp);
			m_dowear(level, mtmp, FALSE); /* might want speed boots */
			if (u.uswallow && (mtmp == u.ustuck) &&
			    is_whirly(mtmp->data)) {
				pline("You disrupt %s!", mon_nam(mtmp));
				pline("A huge hole opens up...");
				expels(mtmp, mtmp->data, TRUE);
			}
		}
		break;
	case WAN_SPEED_MONSTER:
		if (!resist(mtmp, otmp->oclass, 0, NOTELL)) {
			mon_adjust_speed(mtmp, 1, otmp);
			m_dowear(level, mtmp, FALSE); /* might want speed boots */
		}
		break;
	case WAN_UNDEAD_TURNING:
	case SPE_TURN_UNDEAD:
		wake = FALSE;
		if (unturn_dead(mtmp)) wake = TRUE;
		if (is_undead(mtmp->data)) {
			reveal_invis = TRUE;
			wake = TRUE;
			dmg = rnd(8);
			if (dbldam) dmg *= 2;
			if (otyp == SPE_TURN_UNDEAD)
				dmg += spell_damage_bonus();
			flags.bypasses = TRUE;	/* for make_corpse() */
			if (!resist(mtmp, otmp->oclass, dmg, NOTELL)) {
			    if (mtmp->mhp > 0) monflee(mtmp, 0, FALSE, TRUE);
			}
		}
		break;
	case WAN_POLYMORPH:
	case SPE_POLYMORPH:
	case POT_POLYMORPH:
		if (resists_magm(mtmp)) {
		    /* magic resistance protects from polymorph traps, so make
		       it guard against involuntary polymorph attacks too... */
		    shieldeff(mtmp->mx, mtmp->my);
		} else if (!resist(mtmp, otmp->oclass, 0, NOTELL)) {
		    /* natural shapechangers aren't affected by system shock
		       (unless protection from shapechangers is interfering
		       with their metabolism...) */
		    if (mtmp->cham == CHAM_ORDINARY && !rn2(25)) {
			if (canseemon(level, mtmp)) {
			    pline("%s shudders!", Monnam(mtmp));
			    makeknown(otyp);
			}
			/* dropped inventory shouldn't be hit by this zap */
			for (obj = mtmp->minvent; obj; obj = obj->nobj)
			    bypass_obj(obj);
			/* flags.bypasses = TRUE; ## for make_corpse() */
			/* no corpse after system shock */
			xkilled(mtmp, 3);
		    } else if (newcham(level, mtmp, NULL,
				       (otyp != POT_POLYMORPH), FALSE)) {
			if (!Hallucination && canspotmon(level, mtmp))
			    makeknown(otyp);
		    }
		}
		break;
	case WAN_CANCELLATION:
	case SPE_CANCELLATION:
		cancel_monst(mtmp, otmp, TRUE, TRUE, FALSE);
		break;
	case WAN_TELEPORTATION:
	case SPE_TELEPORT_AWAY:
		reveal_invis = !u_teleport_mon(mtmp, TRUE);
		break;
	case WAN_MAKE_INVISIBLE:
	    {
		int oldinvis = mtmp->minvis;
		char nambuf[BUFSZ];

		/* format monster's name before altering its visibility */
		strcpy(nambuf, Monnam(mtmp));
		mon_set_minvis(mtmp);
		if (!oldinvis && knowninvisible(mtmp)) {
		    pline("%s turns transparent!", nambuf);
		    makeknown(otyp);
		}
		break;
	    }
	case WAN_NOTHING:
	case WAN_LOCKING:
	case SPE_WIZARD_LOCK:
		wake = FALSE;
		break;
	case WAN_PROBING:
		wake = FALSE;
		reveal_invis = TRUE;
		probe_monster(mtmp);
		makeknown(otyp);
		break;
	case WAN_OPENING:
	case SPE_KNOCK:
		wake = FALSE;	/* don't want immediate counterattack */
		if (u.uswallow && mtmp == u.ustuck) {
			if (is_animal(mtmp->data)) {
				if (Blind) pline("You feel a sudden rush of air!");
				else pline("%s opens its mouth!", Monnam(mtmp));
			}
			expels(mtmp, mtmp->data, TRUE);
		} else if (!!(obj = which_armor(mtmp, W_SADDLE))) {
			mtmp->misc_worn_check &= ~obj->owornmask;
			update_mon_intrinsics(level, mtmp, obj, FALSE, FALSE);
			obj->owornmask = 0L;
			obj_extract_self(obj);
			place_object(obj, level, mtmp->mx, mtmp->my);
			/* call stackobj() if we ever drop anything that can merge */
			newsym(mtmp->mx, mtmp->my);
		}
		break;
	case SPE_HEALING:
	case SPE_EXTRA_HEALING:
		reveal_invis = TRUE;
	    if (mtmp->data != &mons[PM_PESTILENCE]) {
		wake = FALSE;		/* wakeup() makes the target angry */
		mtmp->mhp += dice(6, otyp == SPE_EXTRA_HEALING ? 8 : 4);
		if (mtmp->mhp > mtmp->mhpmax)
		    mtmp->mhp = mtmp->mhpmax;
		if (mtmp->mblinded) {
		    mtmp->mblinded = 0;
		    mtmp->mcansee = 1;
		}
		if (canseemon(level, mtmp)) {
		    if (disguised_mimic) {
			if (mtmp->m_ap_type == M_AP_OBJECT &&
			    mtmp->mappearance == STRANGE_OBJECT) {
			    /* it can do better now */
			    set_mimic_sym(mtmp, level);
			    newsym(mtmp->mx, mtmp->my);
			} else
			    mimic_hit_msg(mtmp, otyp);
		    } else pline("%s looks%s better.", Monnam(mtmp),
				 otyp == SPE_EXTRA_HEALING ? " much" : "" );
		}
		if (mtmp->mtame || mtmp->mpeaceful) {
		    adjalign(Role_if (PM_HEALER) ? 1 : sgn(u.ualign.type));
		}
	    } else {	/* Pestilence */
		/* Pestilence will always resist; damage is half of 3d{4,8} */
		resist(mtmp, otmp->oclass,
			      dice(3, otyp == SPE_EXTRA_HEALING ? 8 : 4), TELL);
	    }
		break;
	case WAN_LIGHT:	/* (broken wand) */
		if (flash_hits_mon(mtmp, otmp)) {
		    makeknown(WAN_LIGHT);
		    reveal_invis = TRUE;
		}
		break;
	case WAN_SLEEP:	/* (broken wand) */
		/* [wakeup() doesn't rouse victims of temporary sleep,
		    so it's okay to leave `wake' set to TRUE here] */
		reveal_invis = TRUE;
		if (sleep_monst(mtmp, dice(1 + otmp->spe, 12), WAND_CLASS))
		    slept_monst(mtmp);
		if (!Blind) makeknown(WAN_SLEEP);
		break;
	case SPE_STONE_TO_FLESH:
		if (monsndx(mtmp->data) == PM_STONE_GOLEM) {
		    char *name = Monnam(mtmp);
		    /* turn into flesh golem */
		    if (newcham(level, mtmp, &mons[PM_FLESH_GOLEM], FALSE, FALSE)) {
			if (canseemon(level, mtmp))
			    pline("%s turns to flesh!", name);
		    } else {
			if (canseemon(level, mtmp))
			    pline("%s looks rather fleshy for a moment.",
				  name);
		    }
		} else
		    wake = FALSE;
		break;
	case SPE_DRAIN_LIFE:
		dmg = rnd(8);
		if (dbldam) dmg *= 2;
		if (otyp == SPE_DRAIN_LIFE)
			dmg += spell_damage_bonus();
		if (resists_drli(mtmp))
		    shieldeff(mtmp->mx, mtmp->my);
		else if (!resist(mtmp, otmp->oclass, dmg, NOTELL) &&
				mtmp->mhp > 0) {
		    mtmp->mhp -= dmg;
		    mtmp->mhpmax -= dmg;
		    if (mtmp->mhp <= 0 || mtmp->mhpmax <= 0 || mtmp->m_lev < 1)
			xkilled(mtmp, 1);
		    else {
			mtmp->m_lev--;
			if (canseemon(level, mtmp))
			    pline("%s suddenly seems weaker!", Monnam(mtmp));
		    }
		}
		break;
	default:
		warning("What an interesting effect (%d)", otyp);
		break;
	}
	if (wake) {
	    if (mtmp->mhp > 0) {
		wakeup(mtmp);
		m_respond(mtmp);
		if (mtmp->isshk && !*u.ushops) hot_pursuit(mtmp);
	    } else if (mtmp->m_ap_type)
		seemimic(mtmp); /* might unblock if mimicing a boulder/door */
	}
	/* note: bhitpos won't be set if swallowed, but that's okay since
	 * reveal_invis will be false.  We can't use mtmp->mx, my since it
	 * might be an invisible worm hit on the tail.
	 */
	if (reveal_invis) {
	    if (mtmp->mhp > 0 && cansee(bhitpos.x, bhitpos.y) &&
							!canspotmon(level, mtmp))
		map_invisible(bhitpos.x, bhitpos.y);
	}
	return 0;
}